

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QByteArray * __thiscall
QMetaEnumBuilder::name(QByteArray *__return_storage_ptr__,QMetaEnumBuilder *this)

{
  QMetaEnumBuilderPrivate *other;
  
  other = d_func(this);
  if (other == (QMetaEnumBuilderPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char> *)other);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaEnumBuilder::name() const
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d)
        return d->name;
    else
        return QByteArray();
}